

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitStringEq(BinaryInstWriter *this,StringEq *curr)

{
  BufferWithRandomAccess *pBVar1;
  U32LEB local_20;
  U32LEB local_1c;
  StringEq *local_18;
  StringEq *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (StringEq *)this;
  BufferWithRandomAccess::operator<<(this->o,-5);
  if (local_18->op == StringEqEqual) {
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,0x89);
    BufferWithRandomAccess::operator<<(pBVar1,local_1c);
  }
  else {
    if (local_18->op != StringEqCompare) {
      handle_unreachable("invalid string.eq*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0xa32);
    }
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_20,0xa8);
    BufferWithRandomAccess::operator<<(pBVar1,local_20);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitStringEq(StringEq* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  switch (curr->op) {
    case StringEqEqual:
      o << U32LEB(BinaryConsts::StringEq);
      break;
    case StringEqCompare:
      o << U32LEB(BinaryConsts::StringCompare);
      break;
    default:
      WASM_UNREACHABLE("invalid string.eq*");
  }
}